

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O3

void __thiscall fasttext::Vector::addRow(Vector *this,Matrix *A,int64_t i)

{
  long lVar1;
  real *prVar2;
  real *prVar3;
  long lVar4;
  
  if (i < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/vector.cc"
                  ,0x31,"void fasttext::Vector::addRow(const Matrix &, int64_t)");
  }
  if (i < A->m_) {
    lVar1 = this->m_;
    if (lVar1 == A->n_) {
      if (0 < lVar1) {
        prVar2 = A->data_;
        prVar3 = this->data_;
        lVar4 = 0;
        do {
          prVar3[lVar4] = prVar2[i * lVar1 + lVar4] + prVar3[lVar4];
          lVar4 = lVar4 + 1;
        } while (lVar1 != lVar4);
      }
      return;
    }
    __assert_fail("m_ == A.n_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/vector.cc"
                  ,0x33,"void fasttext::Vector::addRow(const Matrix &, int64_t)");
  }
  __assert_fail("i < A.m_",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/vector.cc"
                ,0x32,"void fasttext::Vector::addRow(const Matrix &, int64_t)");
}

Assistant:

void Vector::addRow(const Matrix& A, int64_t i) {
  //std::cout << A.m_ << std::endl;
  //std::cout << A.n_ << std::endl;
  assert(i >= 0);
  assert(i < A.m_);
  assert(m_ == A.n_);
  for (int64_t j = 0; j < A.n_; j++) {
    data_[j] += A.data_[i * A.n_ + j];
  }
}